

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O1

void __thiscall wasm::AfterEffectModuleChecker::check(AfterEffectModuleChecker *this)

{
  Module *pMVar1;
  pointer puVar2;
  pointer puVar3;
  _Head_base<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_false> _Var4
  ;
  tuple<wasm::Function_*,_std::default_delete<wasm::Function>_> tVar5;
  ulong uVar6;
  pointer puVar7;
  uint uVar8;
  ulong uVar9;
  AfterEffectFunctionChecker *checker;
  pointer this_00;
  pointer pAVar10;
  bool bVar11;
  
  if (this->beganWithAnyStackIR == true) {
    pMVar1 = this->module;
    puVar2 = (pMVar1->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (pMVar1->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar11 = puVar2 != puVar3;
    if (bVar11) {
      _Var4._M_head_impl =
           *(vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_> **)
            &(((puVar2->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->stackIR)._M_t;
      puVar7 = puVar2;
      while ((tuple<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
              )_Var4._M_head_impl ==
             (_Head_base<0UL,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_false>
              )0x0) {
        puVar7 = puVar7 + 1;
        bVar11 = puVar7 != puVar3;
        if (puVar7 == puVar3) break;
        _Var4._M_head_impl =
             *(vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_> **)
              &(((puVar7->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->stackIR)._M_t;
      }
    }
    if (bVar11) {
      if (((long)(this->checkers).
                 super__Vector_base<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->checkers).
                 super__Vector_base<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 -
          ((long)(pMVar1->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3) != 0) {
        error(this);
      }
      this_00 = (this->checkers).
                super__Vector_base<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pAVar10 = (this->checkers).
                super__Vector_base<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pAVar10 != this_00) {
        uVar8 = 1;
        uVar9 = 0;
        do {
          tVar5.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
          super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
               *(_Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_> *)
                &(this->module->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar9]._M_t.
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>;
          if ((tVar5.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl !=
               (_Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>)
               this_00[uVar9].func) ||
             (*(Expression **)
               ((long)tVar5.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x60) !=
              *(Expression **)((long)this_00[uVar9].func + 0x60))) {
            error(this);
          }
          if (*(char **)((long)(this->module->functions).
                               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar9]._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                        + 8) !=
              *(char **)((long)&(this->checkers).
                                super__Vector_base<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar9].name.super_IString.
                                str + 8)) {
            error(this);
          }
          uVar9 = (ulong)uVar8;
          this_00 = (this->checkers).
                    super__Vector_base<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pAVar10 = (this->checkers).
                    super__Vector_base<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          uVar6 = ((long)pAVar10 - (long)this_00 >> 3) * -0x3333333333333333;
          uVar8 = uVar8 + 1;
        } while (uVar9 <= uVar6 && uVar6 - uVar9 != 0);
      }
      for (; this_00 != pAVar10; this_00 = this_00 + 1) {
        AfterEffectFunctionChecker::check(this_00);
      }
    }
  }
  return;
}

Assistant:

void check() {
    if (beganWithAnyStackIR && hasAnyStackIR()) {
      // If anything changed to the functions, that's not good.
      if (checkers.size() != module->functions.size()) {
        error();
      }
      for (Index i = 0; i < checkers.size(); i++) {
        // Did a pointer change? (a deallocated function could cause that)
        if (module->functions[i].get() != checkers[i].func ||
            module->functions[i]->body != checkers[i].func->body) {
          error();
        }
        // Did a name change?
        if (module->functions[i]->name != checkers[i].name) {
          error();
        }
      }
      // Global function state appears to not have been changed: the same
      // functions are there. Look into their contents.
      for (auto& checker : checkers) {
        checker.check();
      }
    }
  }